

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testSetDoubleNoTags_Test::~Engine_testSetDoubleNoTags_Test
          (Engine_testSetDoubleNoTags_Test *this)

{
  void *in_RDI;
  
  ~Engine_testSetDoubleNoTags_Test((Engine_testSetDoubleNoTags_Test *)0x130428);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Engine, testSetDoubleNoTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Set("gauge.value", 100.0005);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->doubleMeasures.size());
    auto im = th->doubleMeasures[0];
    ASSERT_EQ("test.gauge.value", im.name);
    ASSERT_EQ(MetricType::Gauge, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100.0005, im.value);
    ASSERT_EQ(0, im.tags.size());
}